

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

Value * __thiscall Json::Value::operator[](Value *this,ArrayIndex index)

{
  map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
  *this_00;
  bool bVar1;
  ValueType VVar2;
  Value *__y;
  reference ppVar3;
  bool local_289;
  const_iterator local_260;
  _Base_ptr local_258;
  undefined1 local_250 [8];
  value_type defaultValue;
  _Self local_210;
  _Self local_208;
  iterator it;
  CZString key;
  String local_1c8;
  ostringstream local_198 [8];
  OStringStream oss;
  ArrayIndex index_local;
  Value *this_local;
  
  VVar2 = type(this);
  if ((VVar2 != nullValue) && (VVar2 = type(this), VVar2 != arrayValue)) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::operator<<((ostream *)local_198,
                    "in Json::Value::operator[](ArrayIndex): requires arrayValue");
    std::__cxx11::ostringstream::str();
    throwLogicError(&local_1c8);
  }
  VVar2 = type(this);
  if (VVar2 == nullValue) {
    Value((Value *)&key.field_1.storage_,arrayValue);
    operator=(this,(Value *)&key.field_1.storage_);
    ~Value((Value *)&key.field_1.storage_);
  }
  CZString::CZString((CZString *)&it,index);
  local_208._M_node =
       (_Base_ptr)
       std::
       map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
       ::lower_bound((this->value_).map_,(CZString *)&it);
  local_210._M_node =
       (_Base_ptr)
       std::
       map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
       ::end((this->value_).map_);
  bVar1 = std::operator!=(&local_208,&local_210);
  local_289 = false;
  if (bVar1) {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                       (&local_208);
    local_289 = CZString::operator==(&ppVar3->first,(CZString *)&it);
  }
  if (local_289 == false) {
    __y = nullSingleton();
    std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
              ((pair<const_Json::Value::CZString,_Json::Value> *)local_250,(CZString *)&it,__y);
    this_00 = (map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
               *)(this->value_).map_;
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_260,&local_208);
    local_258 = (_Base_ptr)
                std::
                map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                ::insert<std::pair<Json::Value::CZString_const,Json::Value>&>
                          (this_00,local_260,
                           (pair<const_Json::Value::CZString,_Json::Value> *)local_250);
    local_208._M_node = local_258;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                       (&local_208);
    defaultValue.second.limit_._4_4_ = 1;
    std::pair<const_Json::Value::CZString,_Json::Value>::~pair
              ((pair<const_Json::Value::CZString,_Json::Value> *)local_250);
  }
  else {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                       (&local_208);
    defaultValue.second.limit_._4_4_ = 1;
  }
  this_local = &ppVar3->second;
  CZString::~CZString((CZString *)&it);
  return this_local;
}

Assistant:

Value& Value::operator[](ArrayIndex index) {
  JSON_ASSERT_MESSAGE(
      type() == nullValue || type() == arrayValue,
      "in Json::Value::operator[](ArrayIndex): requires arrayValue");
  if (type() == nullValue)
    *this = Value(arrayValue);
  CZString key(index);
  auto it = value_.map_->lower_bound(key);
  if (it != value_.map_->end() && (*it).first == key)
    return (*it).second;

  ObjectValues::value_type defaultValue(key, nullSingleton());
  it = value_.map_->insert(it, defaultValue);
  return (*it).second;
}